

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Salsa20.c
# Opt level: O3

void Hacl_Salsa20_salsa20_key_block0(uint8_t *out,uint8_t *key,uint8_t *n)

{
  uint32_t k [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  uint32_t local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined4 local_44;
  undefined8 local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined4 local_1c;
  
  local_40 = *(undefined8 *)n;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_58 = 0x61707865;
  local_54 = *(undefined8 *)key;
  uStack_4c = *(undefined8 *)(key + 8);
  local_44 = 0x3320646e;
  local_38 = 0;
  local_30 = 0x79622d32;
  local_2c = *(undefined8 *)(key + 0x10);
  uStack_24 = *(undefined8 *)(key + 0x18);
  local_1c = 0x6b206574;
  salsa20_core((uint32_t *)&local_98,&local_58,0);
  *(undefined8 *)out = local_98;
  *(undefined8 *)(out + 8) = uStack_90;
  *(undefined8 *)(out + 0x10) = local_88;
  *(undefined8 *)(out + 0x18) = uStack_80;
  *(undefined8 *)(out + 0x20) = local_78;
  *(undefined8 *)(out + 0x28) = uStack_70;
  *(undefined8 *)(out + 0x30) = local_68;
  *(undefined8 *)(out + 0x38) = uStack_60;
  return;
}

Assistant:

void Hacl_Salsa20_salsa20_key_block0(uint8_t *out, uint8_t *key, uint8_t *n)
{
  salsa20_key_block0(out, key, n);
}